

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O1

size_t __thiscall llvm::cl::generic_parser_base::getOptionWidth(generic_parser_base *this,Option *O)

{
  uint uVar1;
  long extraout_RDX;
  long extraout_RDX_00;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  
  if ((O->ArgStr).Length == 0) {
    uVar1 = (*this->_vptr_generic_parser_base[2])(this);
    uVar4 = 0;
    if (uVar1 == 0) {
      uVar2 = 0;
    }
    else {
      uVar2 = 0;
      do {
        (*this->_vptr_generic_parser_base[3])(this,uVar4);
        if (uVar2 <= extraout_RDX_00 + 8U) {
          uVar2 = extraout_RDX_00 + 8U;
        }
        uVar3 = (int)uVar4 + 1;
        uVar4 = (ulong)uVar3;
      } while (uVar1 != uVar3);
    }
  }
  else {
    uVar2 = (O->ArgStr).Length + 6;
    uVar1 = (*this->_vptr_generic_parser_base[2])(this);
    if (uVar1 != 0) {
      uVar4 = 0;
      do {
        (*this->_vptr_generic_parser_base[3])(this,uVar4);
        if (uVar2 <= extraout_RDX + 8U) {
          uVar2 = extraout_RDX + 8U;
        }
        uVar3 = (int)uVar4 + 1;
        uVar4 = (ulong)uVar3;
      } while (uVar1 != uVar3);
    }
  }
  return uVar2;
}

Assistant:

size_t generic_parser_base::getOptionWidth(const Option &O) const {
  if (O.hasArgStr()) {
    size_t Size = O.ArgStr.size() + 6;
    for (unsigned i = 0, e = getNumOptions(); i != e; ++i)
      Size = std::max(Size, getOption(i).size() + 8);
    return Size;
  } else {
    size_t BaseSize = 0;
    for (unsigned i = 0, e = getNumOptions(); i != e; ++i)
      BaseSize = std::max(BaseSize, getOption(i).size() + 8);
    return BaseSize;
  }
}